

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WindowCodeStep(Parse *pParse,Select *p,WhereInfo *pWInfo,int regGosub,int addrGosub)

{
  Window **ppWVar1;
  short sVar2;
  uint p1;
  int iVar3;
  Window *pWVar4;
  ExprList *pOrderBy;
  ExprList *pEVar5;
  FuncDef *pFVar6;
  char *pcVar7;
  u8 uVar8;
  int iVar9;
  uint p1_00;
  int iVar10;
  int iVar11;
  int iVar12;
  ExprList *pList;
  Vdbe *p_00;
  KeyInfo *p4;
  Vdbe *p_01;
  int iVar13;
  Op *pOVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int p1_01;
  Window *pWVar18;
  int iVar19;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_c0;
  WindowCodeArg local_88;
  int local_48;
  int local_44;
  int local_40;
  uint local_3c;
  WhereInfo *local_38;
  
  pWVar4 = p->pWin;
  pOrderBy = pWVar4->pOrderBy;
  local_38 = pWInfo;
  p_00 = sqlite3GetVdbe(pParse);
  iVar12 = p->pSrc->a[0].iCursor;
  sVar2 = (p->pSrc->a[0].pTab)->nCol;
  iVar19 = (int)sVar2;
  iVar9 = pParse->nLabel + -1;
  pParse->nLabel = iVar9;
  local_88.regArg = 0;
  local_88.eDelete = 0;
  p1 = pWVar4->iEphCsr;
  local_88.current.reg = 0;
  local_88.current.csr = p1;
  uVar16 = p1 + 2;
  local_88.start.reg = 0;
  local_88.start.csr = uVar16;
  p1_00 = p1 + 3;
  local_88.end.reg = 0;
  local_88.end.csr = p1_00;
  local_88.pParse = pParse;
  local_88.pMWin = pWVar4;
  local_88.pVdbe = p_00;
  local_88.regGosub = regGosub;
  local_88.addrGosub = addrGosub;
  if (pWVar4->eStart == 'W') {
    pWVar18 = pWVar4;
    if (pWVar4->regStartRowid == 0) {
      do {
        pcVar7 = pWVar18->pFunc->zName;
        if ((((pcVar7 == "lag") || (pcVar7 == "lead")) || (pcVar7 == "nth_value")) ||
           (pcVar7 == "first_value")) goto LAB_0017ad37;
        ppWVar1 = &pWVar18->pNextWin;
        pWVar18 = *ppWVar1;
      } while (*ppWVar1 != (Window *)0x0);
      iVar11 = 1;
      if (pWVar4->eEnd != 'U') goto LAB_0017ad30;
      if (pWVar4->eFrmType != 'V') {
        iVar10 = windowExprGtZero((Parse *)pParse->db,pWVar4->pEnd);
        iVar11 = 3;
        goto LAB_0017acb7;
      }
    }
  }
  else {
    iVar11 = 2;
    if (pWVar4->eStart == 'S') {
      if (pWVar4->eFrmType != 'V') {
        iVar10 = windowExprGtZero((Parse *)pParse->db,pWVar4->pStart);
        iVar11 = 1;
LAB_0017acb7:
        if (iVar10 != 0) goto LAB_0017ad30;
      }
    }
    else {
LAB_0017ad30:
      local_88.eDelete = iVar11;
    }
  }
LAB_0017ad37:
  iVar11 = pParse->nMem;
  iVar10 = iVar11 + iVar19 + 2;
  pParse->nMem = iVar10;
  if ((pWVar4->eStart == 'U') || (local_dc = 0, iVar13 = iVar10, pWVar4->eStart == 'S')) {
    iVar13 = iVar11 + iVar19 + 3;
    pParse->nMem = iVar13;
    local_dc = iVar13;
  }
  if ((pWVar4->eEnd == 'U') || (pWVar4->eEnd == 'S')) {
    iVar13 = iVar13 + 1;
    pParse->nMem = iVar13;
    local_d8 = iVar13;
  }
  else {
    local_d8 = 0;
  }
  iVar17 = iVar11 + 1;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_d4 = 0;
  p1_01 = 0;
  if (pWVar4->eFrmType != 'L') {
    if (pOrderBy == (ExprList *)0x0) {
      iVar15 = 0;
    }
    else {
      iVar15 = pOrderBy->nExpr;
    }
    p1_01 = pWVar4->nBufferCol + iVar17;
    if (pWVar4->pPartition != (ExprList *)0x0) {
      p1_01 = p1_01 + pWVar4->pPartition->nExpr;
    }
    local_d4 = iVar13 + 1;
    local_48 = iVar13 + iVar15 + 1;
    local_88.start.reg = local_48;
    local_44 = iVar15 + iVar13 + iVar15 + 1;
    iVar13 = iVar13 + iVar15 + iVar15;
    local_88.current.reg = local_44;
    local_40 = iVar15 + iVar13 + 1;
    local_88.end.reg = local_40;
    pParse->nMem = iVar15 * 2 + iVar13;
  }
  iVar11 = iVar11 + iVar19 + 1;
  local_3c = uVar16;
  if (0 < sVar2) {
    iVar13 = 0;
    do {
      sqlite3VdbeAddOp3(p_00,0x5a,iVar12,iVar13,iVar13 + iVar17);
      iVar13 = iVar13 + 1;
    } while (iVar19 != iVar13);
  }
  iVar13 = p1 + 1;
  sqlite3VdbeAddOp3(p_00,0x5c,iVar17,iVar19,iVar11);
  pEVar5 = pWVar4->pPartition;
  iVar19 = 0;
  local_c0 = 0;
  iVar12 = 0;
  if (pEVar5 != (ExprList *)0x0) {
    iVar15 = pEVar5->nExpr;
    iVar17 = iVar17 + pWVar4->nBufferCol;
    p4 = sqlite3KeyInfoFromExprList(pParse,pEVar5,0,0);
    local_c0 = pParse->nMem + 1;
    pParse->nMem = local_c0;
    iVar12 = sqlite3VdbeAddOp3(p_00,0x57,iVar17,pWVar4->regPart,iVar15);
    if (p_00->db->mallocFailed == '\0') {
      pOVar14 = p_00->aOp;
      iVar3 = p_00->nOp;
      pOVar14[(long)iVar3 + -1].p4type = -9;
      pOVar14[(long)iVar3 + -1].p4.pKeyInfo = p4;
    }
    else {
      freeP4(p_00->db,-9,p4);
    }
    sqlite3VdbeAddOp3(p_00,0x10,iVar12 + 2,iVar12 + 4,iVar12 + 2);
    iVar12 = sqlite3VdbeAddOp3(p_00,0xc,local_c0,0,0);
    sqlite3VdbeAddOp3(p_00,0x4e,iVar17,pWVar4->regPart,iVar15 + -1);
  }
  sqlite3VdbeAddOp3(p_00,0x79,iVar13,iVar10,0);
  sqlite3VdbeAddOp3(p_00,0x7a,iVar13,iVar11,iVar10);
  iVar11 = sqlite3VdbeAddOp3(p_00,0x34,pWVar4->regOne,0,iVar10);
  p_01 = sqlite3GetVdbe(pParse);
  pWVar18 = pWVar4;
  do {
    pFVar6 = pWVar18->pFunc;
    iVar10 = 0;
    sqlite3VdbeAddOp3(p_01,0x49,0,pWVar18->regAccum,0);
    pEVar5 = (pWVar18->pOwner->x).pList;
    if (pEVar5 != (ExprList *)0x0) {
      iVar10 = pEVar5->nExpr;
    }
    if (iVar10 < iVar19) {
      iVar10 = iVar19;
    }
    iVar19 = iVar10;
    if (pWVar4->regStartRowid == 0) {
      pcVar7 = pFVar6->zName;
      if (pcVar7 == "nth_value" || pcVar7 == "first_value") {
        sqlite3VdbeAddOp3(p_01,0x46,0,pWVar18->regApp,0);
        sqlite3VdbeAddOp3(p_01,0x46,0,pWVar18->regApp + 1,0);
      }
      if (((pFVar6->funcFlags & 0x1000) != 0) && (pWVar18->csrApp != 0)) {
        sqlite3VdbeAddOp3(p_01,0x8a,pWVar18->csrApp,0,0);
        sqlite3VdbeAddOp3(p_01,0x46,0,pWVar18->regApp + 1,0);
      }
    }
    pWVar18 = pWVar18->pNextWin;
  } while (pWVar18 != (Window *)0x0);
  iVar10 = pParse->nMem;
  pParse->nMem = iVar19 + iVar10;
  local_88.regArg = iVar10 + 1;
  if (local_dc != 0) {
    sqlite3ExprCode(pParse,pWVar4->pStart,local_dc);
    windowCheckValue(pParse,local_dc,(uint)(pWVar4->eFrmType == 'V') * 3);
  }
  if (local_d8 != 0) {
    sqlite3ExprCode(pParse,pWVar4->pEnd,local_d8);
    windowCheckValue(pParse,local_d8,(uint)(pWVar4->eFrmType == 'V') * 3 + 1);
  }
  uVar8 = pWVar4->eStart;
  if ((local_dc != 0) && (uVar8 == pWVar4->eEnd)) {
    iVar19 = sqlite3VdbeAddOp3(p_00,(uint)(uVar8 == 'S') * 2 + 0x37,local_dc,0,local_d8);
    windowAggFinal((WindowCodeArg *)pParse,(int)pWVar4);
    sqlite3VdbeAddOp3(p_00,0x24,p1,1,0);
    windowReturnOneRow(&local_88);
    sqlite3VdbeAddOp3(p_00,0x8a,p1,0,0);
    sqlite3VdbeAddOp3(p_00,0xb,0,iVar9,0);
    if (p_00->db->mallocFailed == '\0') {
      iVar10 = p_00->nOp + -1;
      if (-1 < iVar19) {
        iVar10 = iVar19;
      }
      pOVar14 = p_00->aOp + iVar10;
    }
    else {
      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar14->p2 = p_00->nOp;
    uVar8 = pWVar4->eStart;
  }
  if (uVar8 == 'S') {
    if ((local_d8 != 0) && (pWVar4->eFrmType != 'V')) {
      sqlite3VdbeAddOp3(p_00,0x65,local_dc,local_d8,local_dc);
      uVar8 = pWVar4->eStart;
      goto LAB_0017b243;
    }
LAB_0017b247:
    sqlite3VdbeAddOp3(p_00,0x24,local_3c,1,0);
  }
  else {
LAB_0017b243:
    if (uVar8 != 'W') goto LAB_0017b247;
  }
  sqlite3VdbeAddOp3(p_00,0x24,p1,1,0);
  sqlite3VdbeAddOp3(p_00,0x24,p1_00,1,0);
  if (pOrderBy != (ExprList *)0x0 && local_d4 != 0) {
    sqlite3VdbeAddOp3(p_00,0x4e,p1_01,local_d4,pOrderBy->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x4e,local_d4,local_48,pOrderBy->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x4e,local_d4,local_44,pOrderBy->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x4e,local_d4,local_40,pOrderBy->nExpr + -1);
  }
  sqlite3VdbeAddOp3(p_00,0xb,0,iVar9,0);
  if (p_00->db->mallocFailed == '\0') {
    iVar19 = p_00->nOp + -1;
    if (-1 < iVar11) {
      iVar19 = iVar11;
    }
    pOVar14 = p_00->aOp + iVar19;
  }
  else {
    pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar14->p2 = p_00->nOp;
  if (local_d4 != 0) {
    windowIfNewPeer(pParse,pOrderBy,p1_01,local_d4,iVar9);
  }
  iVar19 = local_dc;
  if (pWVar4->eStart == 'S') {
    windowCodeOp(&local_88,3,0,0);
    if (pWVar4->eEnd != 'W') {
      if (pWVar4->eFrmType != 'V') {
        windowCodeOp(&local_88,1,local_d8,0);
        iVar11 = 2;
        goto LAB_0017b55d;
      }
      iVar11 = pParse->nLabel + -1;
      pParse->nLabel = iVar11;
      iVar19 = p_00->nOp;
      windowCodeRangeTest(&local_88,0x39,p1,local_d8,p1_00,iVar11);
      windowCodeOp(&local_88,2,local_dc,0);
      windowCodeOp(&local_88,1,0,0);
LAB_0017b5d0:
      sqlite3VdbeAddOp3(p_00,0xb,0,iVar19,0);
      sqlite3VdbeResolveLabel(p_00,iVar11);
    }
  }
  else if (pWVar4->eEnd == 'U') {
    if (pWVar4->eStart == 'U') {
      uVar8 = pWVar4->eFrmType;
      windowCodeOp(&local_88,3,local_d8,0);
      if (uVar8 == 'V') {
        windowCodeOp(&local_88,2,local_dc,0);
        iVar11 = 1;
        iVar19 = 0;
        goto LAB_0017b55d;
      }
    }
    else {
      windowCodeOp(&local_88,3,local_d8,0);
    }
    windowCodeOp(&local_88,1,0,0);
    iVar11 = 2;
LAB_0017b55d:
    windowCodeOp(&local_88,iVar11,iVar19,0);
  }
  else {
    windowCodeOp(&local_88,3,0,0);
    if (pWVar4->eEnd != 'W') {
      if (pWVar4->eFrmType == 'V') {
        iVar19 = p_00->nOp;
        if (local_d8 == 0) {
          iVar11 = 0;
        }
        else {
          iVar11 = pParse->nLabel + -1;
          pParse->nLabel = iVar11;
          windowCodeRangeTest(&local_88,0x39,p1,local_d8,p1_00,iVar11);
        }
        windowCodeOp(&local_88,1,0,0);
        windowCodeOp(&local_88,2,local_dc,0);
        if (local_d8 != 0) goto LAB_0017b5d0;
      }
      else {
        if (local_d8 == 0) {
          iVar19 = 0;
        }
        else {
          iVar19 = sqlite3VdbeAddOp3(p_00,0x2f,local_d8,0,1);
        }
        windowCodeOp(&local_88,1,0,0);
        windowCodeOp(&local_88,2,local_dc,0);
        if (local_d8 != 0) {
          if (p_00->db->mallocFailed == '\0') {
            iVar11 = p_00->nOp + -1;
            if (-1 < iVar19) {
              iVar11 = iVar19;
            }
            pOVar14 = p_00->aOp + iVar11;
          }
          else {
            pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar14->p2 = p_00->nOp;
        }
      }
    }
  }
  sqlite3VdbeResolveLabel(p_00,iVar9);
  sqlite3WhereEnd(local_38);
  if (pWVar4->pPartition == (ExprList *)0x0) {
    iVar9 = 0;
  }
  else {
    iVar9 = sqlite3VdbeAddOp3(p_00,0x46,0,local_c0,0);
    if (p_00->db->mallocFailed == '\0') {
      iVar19 = p_00->nOp + -1;
      if (-1 < iVar12) {
        iVar19 = iVar12;
      }
      pOVar14 = p_00->aOp + iVar19;
    }
    else {
      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar14->p2 = p_00->nOp;
  }
  iVar12 = sqlite3VdbeAddOp3(p_00,0x24,iVar13,0,0);
  uVar8 = pWVar4->eStart;
  if (pWVar4->eEnd != 'U') {
    windowCodeOp(&local_88,3,0,0);
    if (uVar8 == 'S') {
      if (pWVar4->eFrmType == 'V') {
        iVar19 = p_00->nOp;
        iVar10 = windowCodeOp(&local_88,2,local_dc,1);
        iVar11 = windowCodeOp(&local_88,1,0,1);
      }
      else {
        iVar19 = p_00->nOp;
        if (pWVar4->eEnd == 'W') {
          iVar11 = windowCodeOp(&local_88,1,local_dc,1);
          local_dc = 0;
        }
        else {
          iVar11 = windowCodeOp(&local_88,1,local_d8,1);
        }
        iVar10 = windowCodeOp(&local_88,2,local_dc,1);
      }
      sqlite3VdbeAddOp3(p_00,0xb,0,iVar19,0);
      iVar19 = p_00->nOp;
      if (p_00->db->mallocFailed == '\0') {
        iVar13 = iVar19 + -1;
        if (-1 < iVar10) {
          iVar13 = iVar10;
        }
        pOVar14 = p_00->aOp + iVar13;
      }
      else {
        pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar14->p2 = iVar19;
      iVar10 = windowCodeOp(&local_88,1,0,1);
      sqlite3VdbeAddOp3(p_00,0xb,0,iVar19,0);
      iVar19 = p_00->nOp;
      uVar8 = p_00->db->mallocFailed;
      if (uVar8 == '\0') {
        if (iVar11 < 0) {
          iVar11 = iVar19 + -1;
        }
        pOVar14 = p_00->aOp;
        if (iVar10 < 0) {
          iVar10 = iVar19 + -1;
        }
        pOVar14[iVar11].p2 = iVar19;
        pOVar14 = pOVar14 + iVar10;
      }
      else {
        pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
        DAT_00210a70 = iVar19;
      }
      pOVar14->p2 = iVar19;
    }
    else {
      iVar19 = p_00->nOp;
      iVar11 = windowCodeOp(&local_88,1,0,1);
      windowCodeOp(&local_88,2,local_dc,0);
      sqlite3VdbeAddOp3(p_00,0xb,0,iVar19,0);
      iVar19 = p_00->nOp;
      uVar8 = p_00->db->mallocFailed;
      if (uVar8 == '\0') {
        iVar10 = iVar19 + -1;
        if (-1 < iVar11) {
          iVar10 = iVar11;
        }
        pOVar14 = p_00->aOp + iVar10;
      }
      else {
        pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar14->p2 = iVar19;
    }
    goto LAB_0017b94b;
  }
  if (uVar8 == 'U') {
    uVar8 = pWVar4->eFrmType;
    windowCodeOp(&local_88,3,local_d8,0);
    if (uVar8 == 'V') {
      iVar19 = 2;
      goto LAB_0017b748;
    }
  }
  else {
    iVar19 = 3;
    local_dc = local_d8;
LAB_0017b748:
    windowCodeOp(&local_88,iVar19,local_dc,0);
  }
  windowCodeOp(&local_88,1,0,0);
  iVar19 = p_00->nOp;
  uVar8 = p_00->db->mallocFailed;
LAB_0017b94b:
  if (uVar8 == '\0') {
    iVar11 = iVar19 + -1;
    if (-1 < iVar12) {
      iVar11 = iVar12;
    }
    pOVar14 = p_00->aOp + iVar11;
  }
  else {
    pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar14->p2 = iVar19;
  sqlite3VdbeAddOp3(p_00,0x8a,p1,0,0);
  if (pWVar4->pPartition == (ExprList *)0x0) {
    return;
  }
  if (pWVar4->regStartRowid != 0) {
    sqlite3VdbeAddOp3(p_00,0x46,1,pWVar4->regStartRowid,0);
    sqlite3VdbeAddOp3(p_00,0x46,0,pWVar4->regEndRowid,0);
  }
  if (p_00->db->mallocFailed == '\0') {
    iVar12 = p_00->nOp + -1;
    if (-1 < iVar9) {
      iVar12 = iVar9;
    }
    pOVar14 = p_00->aOp + iVar12;
  }
  else {
    pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar14->p1 = p_00->nOp;
  sqlite3VdbeAddOp3(p_00,0x42,local_c0,0,0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowCodeStep(
  Parse *pParse,                  /* Parse context */
  Select *p,                      /* Rewritten SELECT statement */
  WhereInfo *pWInfo,              /* Context returned by sqlite3WhereBegin() */
  int regGosub,                   /* Register for OP_Gosub */
  int addrGosub                   /* OP_Gosub here to return each row */
){
  Window *pMWin = p->pWin;
  ExprList *pOrderBy = pMWin->pOrderBy;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int csrWrite;                   /* Cursor used to write to eph. table */
  int csrInput = p->pSrc->a[0].iCursor;     /* Cursor of sub-select */
  int nInput = p->pSrc->a[0].pTab->nCol;    /* Number of cols returned by sub */
  int iInput;                               /* To iterate through sub cols */
  int addrNe;                     /* Address of OP_Ne */
  int addrGosubFlush = 0;         /* Address of OP_Gosub to flush: */
  int addrInteger = 0;            /* Address of OP_Integer */
  int addrEmpty;                  /* Address of OP_Rewind in flush: */
  int regStart = 0;               /* Value of <expr> PRECEDING */
  int regEnd = 0;                 /* Value of <expr> FOLLOWING */
  int regNew;                     /* Array of registers holding new input row */
  int regRecord;                  /* regNew array in record form */
  int regRowid;                   /* Rowid for regRecord in eph table */
  int regNewPeer = 0;             /* Peer values for new row (part of regNew) */
  int regPeer = 0;                /* Peer values for current row */
  int regFlushPart = 0;           /* Register for "Gosub flush_partition" */
  WindowCodeArg s;                /* Context object for sub-routines */
  int lblWhereEnd;                /* Label just before sqlite3WhereEnd() code */

  assert( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_CURRENT 
       || pMWin->eStart==TK_FOLLOWING || pMWin->eStart==TK_UNBOUNDED 
  );
  assert( pMWin->eEnd==TK_FOLLOWING || pMWin->eEnd==TK_CURRENT 
       || pMWin->eEnd==TK_UNBOUNDED || pMWin->eEnd==TK_PRECEDING 
  );
  assert( pMWin->eExclude==0 || pMWin->eExclude==TK_CURRENT
       || pMWin->eExclude==TK_GROUP || pMWin->eExclude==TK_TIES
       || pMWin->eExclude==TK_NO
  );

  lblWhereEnd = sqlite3VdbeMakeLabel(pParse);

  /* Fill in the context object */
  memset(&s, 0, sizeof(WindowCodeArg));
  s.pParse = pParse;
  s.pMWin = pMWin;
  s.pVdbe = v;
  s.regGosub = regGosub;
  s.addrGosub = addrGosub;
  s.current.csr = pMWin->iEphCsr;
  csrWrite = s.current.csr+1;
  s.start.csr = s.current.csr+2;
  s.end.csr = s.current.csr+3;

  /* Figure out when rows may be deleted from the ephemeral table. There
  ** are four options - they may never be deleted (eDelete==0), they may 
  ** be deleted as soon as they are no longer part of the window frame
  ** (eDelete==WINDOW_AGGINVERSE), they may be deleted as after the row 
  ** has been returned to the caller (WINDOW_RETURN_ROW), or they may
  ** be deleted after they enter the frame (WINDOW_AGGSTEP). */
  switch( pMWin->eStart ){
    case TK_FOLLOWING:
      if( pMWin->eFrmType!=TK_RANGE
       && windowExprGtZero(pParse, pMWin->pStart)
      ){
        s.eDelete = WINDOW_RETURN_ROW;
      }
      break;
    case TK_UNBOUNDED:
      if( windowCacheFrame(pMWin)==0 ){
        if( pMWin->eEnd==TK_PRECEDING ){
          if( pMWin->eFrmType!=TK_RANGE
           && windowExprGtZero(pParse, pMWin->pEnd)
          ){
            s.eDelete = WINDOW_AGGSTEP;
          }
        }else{
          s.eDelete = WINDOW_RETURN_ROW;
        }
      }
      break;
    default:
      s.eDelete = WINDOW_AGGINVERSE;
      break;
  }

  /* Allocate registers for the array of values from the sub-query, the
  ** samve values in record form, and the rowid used to insert said record
  ** into the ephemeral table.  */
  regNew = pParse->nMem+1;
  pParse->nMem += nInput;
  regRecord = ++pParse->nMem;
  regRowid = ++pParse->nMem;

  /* If the window frame contains an "<expr> PRECEDING" or "<expr> FOLLOWING"
  ** clause, allocate registers to store the results of evaluating each
  ** <expr>.  */
  if( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_FOLLOWING ){
    regStart = ++pParse->nMem;
  }
  if( pMWin->eEnd==TK_PRECEDING || pMWin->eEnd==TK_FOLLOWING ){
    regEnd = ++pParse->nMem;
  }

  /* If this is not a "ROWS BETWEEN ..." frame, then allocate arrays of
  ** registers to store copies of the ORDER BY expressions (peer values) 
  ** for the main loop, and for each cursor (start, current and end). */
  if( pMWin->eFrmType!=TK_ROWS ){
    int nPeer = (pOrderBy ? pOrderBy->nExpr : 0);
    regNewPeer = regNew + pMWin->nBufferCol;
    if( pMWin->pPartition ) regNewPeer += pMWin->pPartition->nExpr;
    regPeer = pParse->nMem+1;       pParse->nMem += nPeer;
    s.start.reg = pParse->nMem+1;   pParse->nMem += nPeer;
    s.current.reg = pParse->nMem+1; pParse->nMem += nPeer;
    s.end.reg = pParse->nMem+1;     pParse->nMem += nPeer;
  }

  /* Load the column values for the row returned by the sub-select
  ** into an array of registers starting at regNew. Assemble them into
  ** a record in register regRecord. */
  for(iInput=0; iInput<nInput; iInput++){
    sqlite3VdbeAddOp3(v, OP_Column, csrInput, iInput, regNew+iInput);
  }
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regNew, nInput, regRecord);

  /* An input row has just been read into an array of registers starting
  ** at regNew. If the window has a PARTITION clause, this block generates 
  ** VM code to check if the input row is the start of a new partition.
  ** If so, it does an OP_Gosub to an address to be filled in later. The
  ** address of the OP_Gosub is stored in local variable addrGosubFlush. */
  if( pMWin->pPartition ){
    int addr;
    ExprList *pPart = pMWin->pPartition;
    int nPart = pPart->nExpr;
    int regNewPart = regNew + pMWin->nBufferCol;
    KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pPart, 0, 0);

    regFlushPart = ++pParse->nMem;
    addr = sqlite3VdbeAddOp3(v, OP_Compare, regNewPart, pMWin->regPart, nPart);
    sqlite3VdbeAppendP4(v, (void*)pKeyInfo, P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump, addr+2, addr+4, addr+2);
    VdbeCoverageEqNe(v);
    addrGosubFlush = sqlite3VdbeAddOp1(v, OP_Gosub, regFlushPart);
    VdbeComment((v, "call flush_partition"));
    sqlite3VdbeAddOp3(v, OP_Copy, regNewPart, pMWin->regPart, nPart-1);
  }

  /* Insert the new row into the ephemeral table */
  sqlite3VdbeAddOp2(v, OP_NewRowid, csrWrite, regRowid);
  sqlite3VdbeAddOp3(v, OP_Insert, csrWrite, regRecord, regRowid);
  addrNe = sqlite3VdbeAddOp3(v, OP_Ne, pMWin->regOne, 0, regRowid);
  VdbeCoverageNeverNull(v);

  /* This block is run for the first row of each partition */
  s.regArg = windowInitAccum(pParse, pMWin);

  if( regStart ){
    sqlite3ExprCode(pParse, pMWin->pStart, regStart);
    windowCheckValue(pParse, regStart, 0 + (pMWin->eFrmType==TK_RANGE ? 3 : 0));
  }
  if( regEnd ){
    sqlite3ExprCode(pParse, pMWin->pEnd, regEnd);
    windowCheckValue(pParse, regEnd, 1 + (pMWin->eFrmType==TK_RANGE ? 3 : 0));
  }

  if( pMWin->eStart==pMWin->eEnd && regStart ){
    int op = ((pMWin->eStart==TK_FOLLOWING) ? OP_Ge : OP_Le);
    int addrGe = sqlite3VdbeAddOp3(v, op, regStart, 0, regEnd);
    VdbeCoverageNeverNullIf(v, op==OP_Ge); /* NeverNull because bound <expr> */
    VdbeCoverageNeverNullIf(v, op==OP_Le); /*   values previously checked */
    windowAggFinal(&s, 0);
    sqlite3VdbeAddOp2(v, OP_Rewind, s.current.csr, 1);
    VdbeCoverageNeverTaken(v);
    windowReturnOneRow(&s);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, s.current.csr);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, lblWhereEnd);
    sqlite3VdbeJumpHere(v, addrGe);
  }
  if( pMWin->eStart==TK_FOLLOWING && pMWin->eFrmType!=TK_RANGE && regEnd ){
    assert( pMWin->eEnd==TK_FOLLOWING );
    sqlite3VdbeAddOp3(v, OP_Subtract, regStart, regEnd, regStart);
  }

  if( pMWin->eStart!=TK_UNBOUNDED ){
    sqlite3VdbeAddOp2(v, OP_Rewind, s.start.csr, 1);
    VdbeCoverageNeverTaken(v);
  }
  sqlite3VdbeAddOp2(v, OP_Rewind, s.current.csr, 1);
  VdbeCoverageNeverTaken(v);
  sqlite3VdbeAddOp2(v, OP_Rewind, s.end.csr, 1);
  VdbeCoverageNeverTaken(v);
  if( regPeer && pOrderBy ){
    sqlite3VdbeAddOp3(v, OP_Copy, regNewPeer, regPeer, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.start.reg, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.current.reg, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.end.reg, pOrderBy->nExpr-1);
  }

  sqlite3VdbeAddOp2(v, OP_Goto, 0, lblWhereEnd);

  sqlite3VdbeJumpHere(v, addrNe);

  /* Beginning of the block executed for the second and subsequent rows. */
  if( regPeer ){
    windowIfNewPeer(pParse, pOrderBy, regNewPeer, regPeer, lblWhereEnd);
  }
  if( pMWin->eStart==TK_FOLLOWING ){
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eEnd!=TK_UNBOUNDED ){
      if( pMWin->eFrmType==TK_RANGE ){
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int addrNext = sqlite3VdbeCurrentAddr(v);
        windowCodeRangeTest(&s, OP_Ge, s.current.csr, regEnd, s.end.csr, lbl);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        sqlite3VdbeAddOp2(v, OP_Goto, 0, addrNext);
        sqlite3VdbeResolveLabel(v, lbl);
      }else{
        windowCodeOp(&s, WINDOW_RETURN_ROW, regEnd, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
      }
    }
  }else
  if( pMWin->eEnd==TK_PRECEDING ){
    int bRPS = (pMWin->eStart==TK_PRECEDING && pMWin->eFrmType==TK_RANGE);
    windowCodeOp(&s, WINDOW_AGGSTEP, regEnd, 0);
    if( bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
    if( !bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
  }else{
    int addr = 0;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eEnd!=TK_UNBOUNDED ){
      if( pMWin->eFrmType==TK_RANGE ){
        int lbl = 0;
        addr = sqlite3VdbeCurrentAddr(v);
        if( regEnd ){
          lbl = sqlite3VdbeMakeLabel(pParse);
          windowCodeRangeTest(&s, OP_Ge, s.current.csr, regEnd, s.end.csr, lbl);
        }
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        if( regEnd ){
          sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
          sqlite3VdbeResolveLabel(v, lbl);
        }
      }else{
        if( regEnd ){
          addr = sqlite3VdbeAddOp3(v, OP_IfPos, regEnd, 0, 1);
          VdbeCoverage(v);
        }
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        if( regEnd ) sqlite3VdbeJumpHere(v, addr);
      }
    }
  }

  /* End of the main input loop */
  sqlite3VdbeResolveLabel(v, lblWhereEnd);
  sqlite3WhereEnd(pWInfo);

  /* Fall through */
  if( pMWin->pPartition ){
    addrInteger = sqlite3VdbeAddOp2(v, OP_Integer, 0, regFlushPart);
    sqlite3VdbeJumpHere(v, addrGosubFlush);
  }

  addrEmpty = sqlite3VdbeAddOp1(v, OP_Rewind, csrWrite);
  VdbeCoverage(v);
  if( pMWin->eEnd==TK_PRECEDING ){
    int bRPS = (pMWin->eStart==TK_PRECEDING && pMWin->eFrmType==TK_RANGE);
    windowCodeOp(&s, WINDOW_AGGSTEP, regEnd, 0);
    if( bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
  }else if( pMWin->eStart==TK_FOLLOWING ){
    int addrStart;
    int addrBreak1;
    int addrBreak2;
    int addrBreak3;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eFrmType==TK_RANGE ){
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 1);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    }else
    if( pMWin->eEnd==TK_UNBOUNDED ){
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, regStart, 1);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, 0, 1);
    }else{
      assert( pMWin->eEnd==TK_FOLLOWING );
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, regEnd, 1);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 1);
    }
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak2);
    addrStart = sqlite3VdbeCurrentAddr(v);
    addrBreak3 = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak1);
    sqlite3VdbeJumpHere(v, addrBreak3);
  }else{
    int addrBreak;
    int addrStart;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    addrStart = sqlite3VdbeCurrentAddr(v);
    addrBreak = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak);
  }
  sqlite3VdbeJumpHere(v, addrEmpty);

  sqlite3VdbeAddOp1(v, OP_ResetSorter, s.current.csr);
  if( pMWin->pPartition ){
    if( pMWin->regStartRowid ){
      sqlite3VdbeAddOp2(v, OP_Integer, 1, pMWin->regStartRowid);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pMWin->regEndRowid);
    }
    sqlite3VdbeChangeP1(v, addrInteger, sqlite3VdbeCurrentAddr(v));
    sqlite3VdbeAddOp1(v, OP_Return, regFlushPart);
  }
}